

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

SDL_Rect __thiscall
solitaire::graphics::SDLGraphicsSystem::createDstRect
          (SDLGraphicsSystem *this,Position *position,Area *area)

{
  SDL_Rect SVar1;
  Area *area_local;
  Position *position_local;
  SDLGraphicsSystem *this_local;
  
  SVar1.w = (area->size).width;
  SVar1.x = position->x;
  SVar1.y = position->y;
  SVar1.h = (area->size).height;
  return SVar1;
}

Assistant:

SDL_Rect SDLGraphicsSystem::createDstRect(
    const Position& position, const Area& area) const
{
    return SDL_Rect {
        position.x, position.y,
        area.size.width, area.size.height
    };
}